

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PSymbol * __thiscall PSymbolTable::FindSymbol(PSymbolTable *this,FName *symname,bool searchparents)

{
  PSymbolTable *this_00;
  PSymbolTable *local_60;
  FName local_38;
  FName local_34;
  PSymbol **local_30;
  PSymbol **value;
  FName *pFStack_20;
  bool searchparents_local;
  FName *symname_local;
  PSymbolTable *this_local;
  
  value._7_1_ = searchparents;
  pFStack_20 = symname;
  symname_local = (FName *)this;
  FName::FName(&local_34,symname);
  local_30 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                       (&this->Symbols,&local_34);
  if (((local_30 == (PSymbol **)0x0) && ((value._7_1_ & 1) != 0)) &&
     (this->ParentSymbolTable != (PSymbolTable *)0x0)) {
    this_00 = this->ParentSymbolTable;
    FName::FName(&local_38,symname);
    this_local = (PSymbolTable *)FindSymbol(this_00,&local_38,(bool)(value._7_1_ & 1));
  }
  else {
    if (local_30 == (PSymbol **)0x0) {
      local_60 = (PSymbolTable *)0x0;
    }
    else {
      local_60 = (PSymbolTable *)*local_30;
    }
    this_local = local_60;
  }
  return (PSymbol *)this_local;
}

Assistant:

PSymbol *PSymbolTable::FindSymbol (FName symname, bool searchparents) const
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL && searchparents && ParentSymbolTable != NULL)
	{
		return ParentSymbolTable->FindSymbol(symname, searchparents);
	}
	return value != NULL ? *value : NULL;
}